

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_default_dic_path(OpenJTalk *oj)

{
  _Bool _Var1;
  size_t sVar2;
  long in_RDI;
  char **d;
  char temp [260];
  Open_JTalk *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char **path;
  char local_118 [264];
  long local_10;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_RDI != 0) {
    local_10 = in_RDI;
    clear_path_string(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    sVar2 = strlen(g_data_install_path);
    if (sVar2 != 0) {
      for (path = G_DEFAULT_DIC_DIR_NAMES; *path != (char *)0x0; path = path + 1) {
        _Var1 = search_directory((char *)path,(char *)in_stack_fffffffffffffed8,(char *)0x193398);
        if (_Var1) {
          _Var1 = check_dic_utf_8((char *)CONCAT17(in_stack_ffffffffffffffff,
                                                   in_stack_fffffffffffffff8));
          if (_Var1) {
            strcpy((char *)(local_10 + 8),local_118);
            Open_JTalk_load_dic(in_stack_fffffffffffffed8,(char *)0x193401);
            return true;
          }
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool set_default_dic_path(OpenJTalk *oj)
{
	if (!oj)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 標準のインストールフォルダから可能性のある名前を探す。
	if (g_data_install_path != NULL && strlen(g_data_install_path) != 0)
	{
		for (const char **d = G_DEFAULT_DIC_DIR_NAMES; *d != NULL; d++)
		{
			if (search_directory(g_data_install_path, *d, temp))
			{
				goto check_charset;
			}
		}
	}
	return false;

check_charset:
	if (!check_dic_utf_8(temp))
	{
		return false;
	}
	strcpy(oj->dn_dic_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_dic(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_dic(oj->open_jtalk, temp);
#endif
	return true;
}